

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<Complex> __thiscall Matrix<Complex>::fromNumber(Matrix<Complex> *this,Complex *f)

{
  Complex *extraout_RDX;
  Matrix<Complex> MVar1;
  
  Matrix(this,1,1);
  Complex::operator=(this->arr,f);
  MVar1.arr = extraout_RDX;
  MVar1._0_8_ = this;
  return MVar1;
}

Assistant:

inline static const Matrix fromNumber(Field f)
    {
        Matrix a(1, 1);
        a[0][0] = f;
        return a;
    }